

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O1

int metaAddChild(lua_State *L)

{
  pointer *ppIVar1;
  iterator __position;
  ArenaClass *pAVar2;
  undefined4 uVar3;
  uint *puVar4;
  Idx<Variable> *__args;
  Variable *pVVar5;
  Idx<Variable> id;
  
  puVar4 = (uint *)(*lua_touserdata)(L,1);
  __args = (Idx<Variable> *)(*lua_touserdata)(L,2);
  id._4_4_ = 0;
  id.Raw = *puVar4;
  id._arena = *(Arena<Variable> **)(puVar4 + 2);
  pVVar5 = Arena<Variable>::Index(*(Arena<Variable> **)(puVar4 + 2),id);
  __position._M_current =
       (pVVar5->children).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pVVar5->children).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Idx<Variable>,std::allocator<Idx<Variable>>>::_M_realloc_insert<Idx<Variable>const&>
              ((vector<Idx<Variable>,std::allocator<Idx<Variable>>> *)&pVVar5->children,__position,
               __args);
  }
  else {
    uVar3 = *(undefined4 *)&__args->field_0x4;
    pAVar2 = __args->_arena;
    (__position._M_current)->Raw = __args->Raw;
    *(undefined4 *)&(__position._M_current)->field_0x4 = uVar3;
    (__position._M_current)->_arena = pAVar2;
    ppIVar1 = &(pVVar5->children).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  return 0;
}

Assistant:

int metaAddChild(lua_State* L)
{
	auto* pVar = (Idx<Variable>*)lua_touserdata(L, 1);
	auto* pChild = (Idx<Variable>*)lua_touserdata(L, 2);

	(*pVar)->children.push_back(*pChild);
	return 0;
}